

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

uint32 cnt_class(dtree_node_t *node,uint32 *n_a,uint32 *n_b)

{
  bool bVar1;
  uint32 uVar2;
  uint32 unaff_EBP;
  
  bVar1 = false;
  while ((node->y != (dtree_node_t *)0x0 || (node->n != (dtree_node_str *)0x0))) {
    cnt_class(node->y,n_a,n_b);
    node = node->n;
    if (!bVar1) {
      unaff_EBP = 0;
    }
    bVar1 = true;
  }
  if (node->clust == 0) {
    *n_b = *n_b + 1;
  }
  else {
    *n_a = *n_a + 1;
  }
  uVar2 = 0;
  if (bVar1) {
    uVar2 = unaff_EBP;
  }
  return uVar2;
}

Assistant:

uint32
cnt_class(dtree_node_t *node,
	  uint32 *n_a,
	  uint32 *n_b)
{
    if (IS_LEAF(node)) {
	if (node->clust)
	    ++(*n_a);
	else
	    ++(*n_b);
    }
    else {
	cnt_class(node->y, n_a, n_b);
	cnt_class(node->n, n_a, n_b);
    }
    return 0;
}